

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::FragmentOutputCase::deinit(FragmentOutputCase *this)

{
  code *pcVar1;
  ShaderProgram *this_00;
  bool bVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  Functions *gl;
  FragmentOutputCase *this_local;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  if (this->m_framebuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x440))(1,&this->m_framebuffer);
    this->m_framebuffer = 0;
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_renderbuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x460);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_renderbuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderbuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_renderbuffers);
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void FragmentOutputCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_framebuffer)
	{
		gl.deleteFramebuffers(1, &m_framebuffer);
		m_framebuffer = 0;
	}

	if (!m_renderbuffers.empty())
	{
		gl.deleteRenderbuffers((int)m_renderbuffers.size(), &m_renderbuffers[0]);
		m_renderbuffers.clear();
	}

	delete m_program;
	m_program = DE_NULL;
}